

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O2

void __thiscall
tchecker::details::
lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::visit(lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
        *this,typed_var_expression_t *expr)

{
  expression_type_t eVar1;
  ulong local_40;
  string local_38;
  
  eVar1 = (expr->super_typed_lvalue_expression_t).super_typed_expression_t._type;
  if ((EXPR_TYPE_CLKARRAY < eVar1) ||
     ((0x33cU >> (eVar1 & (EXPR_TYPE_CONJUNCTIVE_FORMULA|EXPR_TYPE_CLKCONSTR_DIAGONAL)) & 1) == 0))
  {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"a variable",(allocator<char> *)&local_40);
    invalid_expression(this,(typed_expression_t *)expr,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  local_40 = 5;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,(value_type_conflict3 *)&local_40);
  local_40 = (ulong)expr->_id;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,(value_type_conflict3 *)&local_40);
  return;
}

Assistant:

virtual void visit(tchecker::typed_var_expression_t const & expr)
  {
    if ((expr.type() != tchecker::EXPR_TYPE_CLKVAR) && (expr.type() != tchecker::EXPR_TYPE_INTVAR) &&
        (expr.type() != tchecker::EXPR_TYPE_LOCALINTVAR) && (expr.type() != tchecker::EXPR_TYPE_CLKARRAY) &&
        (expr.type() != tchecker::EXPR_TYPE_INTARRAY) && (expr.type() != tchecker::EXPR_TYPE_LOCALINTARRAY))
      invalid_expression(expr, "a variable");

    // Write bytecode
    _bytecode_back_inserter = tchecker::VM_PUSH;
    _bytecode_back_inserter = expr.id();
  }